

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x9d9,
                  "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (*(int *)&pObj->pNextFan0 == 0) {
    if (pObj->pNextFan1 != (Ivy_Obj_t *)0x0) {
      __assert_fail("Ivy_ObjFaninVec(pObj) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x9dd,
                    "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    if (pObj->Id != 0) {
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      pObj->pNextFan0 = (Ivy_Obj_t *)(long)iVar1;
      if (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
        uVar2 = vFrontier->nSize;
        if (uVar2 == vFrontier->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vFrontier->pArray,0x80);
            }
            vFrontier->pArray = ppvVar3;
            vFrontier->nCap = 0x10;
          }
          else {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(vFrontier->pArray,(ulong)uVar2 << 4);
            }
            vFrontier->pArray = ppvVar3;
            vFrontier->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar3 = vFrontier->pArray;
        }
        iVar1 = vFrontier->nSize;
        vFrontier->nSize = iVar1 + 1;
        ppvVar3[iVar1] = pObj;
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigObjAddToFrontier( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjSatNum(pObj) )
        return;
    assert( Ivy_ObjSatNum(pObj) == 0 );
    assert( Ivy_ObjFaninVec(pObj) == NULL );
    if ( Ivy_ObjIsConst1(pObj) )
        return;
//printf( "Assigning node %d number %d\n", pObj->Id, p->nSatVars );
    Ivy_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Ivy_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}